

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_char_geq(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  operand local_140;
  operation local_13c [2];
  operand local_134 [2];
  operation local_12c [2];
  operand local_124;
  operation local_120 [2];
  operand local_118 [2];
  operation local_110 [2];
  operand local_108 [2];
  operation local_100 [3];
  operand local_f4 [2];
  operation local_ec [2];
  operand local_e4 [2];
  operation local_dc;
  operand local_d8 [2];
  operation local_d0 [3];
  operand local_c4 [2];
  operation local_bc [2];
  operand local_b4 [2];
  operation local_ac;
  operand local_a8 [2];
  operation local_a0 [3];
  operand local_94 [2];
  operation local_8c;
  string local_88;
  undefined1 local_58 [8];
  string t;
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  std::__cxx11::string::string((string *)(t.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab);
  psVar1 = label;
  if ((ops->safe_primitives & 1U) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_88,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)(t.field_2._M_local_buf + 8),(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    local_8c = CMP;
    local_94[1] = 0x14;
    local_94[0] = NUMBER;
    local_a0[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_8c,local_94 + 1,local_94,(int *)(local_a0 + 2));
    local_a0[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_a0 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&t.field_2 + 8));
    local_a0[0] = MOV;
    local_a8[1] = 0x14;
    local_a8[0] = RCX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_a0,local_a8 + 1,local_a8);
    local_ac = AND;
    local_b4[1] = 0x14;
    local_b4[0] = NUMBER;
    local_bc[1] = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_ac,local_b4 + 1,local_b4,(int *)(local_bc + 1));
    local_bc[0] = CMP;
    local_c4[1] = 0x14;
    local_c4[0] = NUMBER;
    local_d0[2] = 0x17;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_bc,local_c4 + 1,local_c4,(int *)(local_d0 + 2));
    local_d0[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_d0 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&t.field_2 + 8));
    local_d0[0] = MOV;
    local_d8[1] = 0x14;
    local_d8[0] = RDX;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_d0,local_d8 + 1,local_d8);
    local_dc = AND;
    local_e4[1] = 0x14;
    local_e4[0] = NUMBER;
    local_ec[1] = 0xff;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_dc,local_e4 + 1,local_e4,(int *)(local_ec + 1));
    local_ec[0] = CMP;
    local_f4[1] = 0x14;
    local_f4[0] = NUMBER;
    local_100[2] = 0x17;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_ec,local_f4 + 1,local_f4,(int *)(local_100 + 2));
    local_100[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_100 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&t.field_2 + 8));
  }
  local_100[0] = CMP;
  local_108[1] = 0xb;
  local_108[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_100,local_108 + 1,local_108);
  local_110[1] = 0x3c;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_110 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_110[0] = MOV;
  local_118[1] = 9;
  local_118[0] = NUMBER;
  local_120[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_110,local_118 + 1,local_118,(int *)(local_120 + 1));
  local_120[0] = JMP;
  local_124 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_120,&local_124);
  local_12c[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_12c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_12c[0] = MOV;
  local_134[1] = 9;
  local_134[0] = NUMBER;
  local_13c[1] = 0xf;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_12c,local_134 + 1,local_134,(int *)(local_13c + 1));
  local_13c[0] = JMP;
  local_140 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_13c,&local_140);
  if ((ops->safe_primitives & 1U) != 0) {
    error_label(code,(string *)((long)&t.field_2 + 8),re_char_geq_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(t.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_char_geq(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string t = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RCX);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    code.add(asmcode::MOV, asmcode::R11, asmcode::RDX);
    code.add(asmcode::AND, asmcode::R11, asmcode::NUMBER, char_mask);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, char_tag);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::CMP, asmcode::RCX, asmcode::RDX);
  code.add(asmcode::JGES, t);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, t);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_t);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_char_geq_contract_violation);
    }
  }